

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O0

void __thiscall
cmDocumentationFormatter::PrintPreformatted(cmDocumentationFormatter *this,ostream *os,char *text)

{
  bool bVar1;
  char *local_30;
  char *ptr;
  bool newline;
  char *text_local;
  ostream *os_local;
  cmDocumentationFormatter *this_local;
  
  bVar1 = true;
  for (local_30 = text; *local_30 != '\0'; local_30 = local_30 + 1) {
    if ((bVar1) && (*local_30 != '\n')) {
      std::operator<<(os,this->TextIndent);
      bVar1 = false;
    }
    std::operator<<(os,*local_30);
    if (*local_30 == '\n') {
      bVar1 = true;
    }
  }
  std::operator<<(os,"\n");
  return;
}

Assistant:

void cmDocumentationFormatter::PrintPreformatted(std::ostream& os,
                                                     const char* text)
{
  bool newline = true;
  for(const char* ptr = text; *ptr; ++ptr)
    {
    if(newline && *ptr != '\n')
      {
      os << this->TextIndent;
      newline = false;
      }
    os << *ptr;
    if(*ptr == '\n')
      {
      newline = true;
      }
    }
  os << "\n";
}